

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::~ExceptionOr
          (ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this)

{
  if ((this->value).ptr.isSet == true) {
    Array<kj::(anonymous_namespace)::SocketAddress>::~Array(&(this->value).ptr.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr() = default;